

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fossilize.cpp
# Opt level: O2

bool __thiscall
Fossilize::StateRecorder::Impl::serialize_shader_module
          (Impl *this,Hash hash,VkShaderModuleCreateInfo *create_info,
          vector<unsigned_char,_std::allocator<unsigned_char>_> *blob,
          ScratchAllocator *blob_allocator)

{
  pointer __dest;
  MemoryPoolAllocator<rapidjson::CrtAllocator> *allocator;
  size_t size;
  uint8_t *buffer;
  Ch *__src;
  MemoryPoolAllocator<rapidjson::CrtAllocator> *allocator_00;
  Value serialized_shader_modules;
  Value varint;
  StringRefType local_168;
  StringRefType local_158;
  StringRefType local_148;
  StringRefType local_138;
  StringRefType local_128;
  StringRefType local_118;
  Writer<rapidjson::GenericStringBuffer<rapidjson::UTF8<char>,_rapidjson::CrtAllocator>,_rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator,_0U>
  local_108;
  Document doc;
  Stack<rapidjson::CrtAllocator> local_68;
  
  rapidjson::
  GenericDocument<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,_rapidjson::CrtAllocator>
  ::GenericDocument(&doc,(MemoryPoolAllocator<rapidjson::CrtAllocator> *)0x0,0x400,
                    (CrtAllocator *)0x0);
  doc.
  super_GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
  .data_.n = (Number)0x0;
  doc.
  super_GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
  .data_.s.str = (Ch *)0x3000000000000;
  allocator = rapidjson::
              GenericDocument<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,_rapidjson::CrtAllocator>
              ::GetAllocator(&doc);
  serialized_shader_modules.data_.n = (Number)0x0;
  serialized_shader_modules.data_.s.str = (Ch *)0x3000000000000;
  size = compute_size_varint(create_info->pCode,create_info->codeSize >> 2);
  buffer = (uint8_t *)ScratchAllocator::allocate_raw(blob_allocator,size,0x40);
  encode_varint(buffer,create_info->pCode,create_info->codeSize >> 2);
  varint.data_.n = (Number)0x0;
  varint.data_.s.str = (Ch *)0x3000000000000;
  local_118.s = "varintOffset";
  local_118.length = 0xc;
  rapidjson::
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
  AddMember<int>(&varint,&local_118,0,allocator);
  local_128.s = "varintSize";
  local_128.length = 10;
  rapidjson::
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
  AddMember<unsigned_long>(&varint,&local_128,size,allocator);
  local_138.s = "codeSize";
  local_138.length = 8;
  rapidjson::
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
  AddMember<unsigned_long>(&varint,&local_138,create_info->codeSize,allocator);
  local_148.s = "flags";
  local_148.length = 5;
  rapidjson::
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
  AddMember<int>(&varint,&local_148,0,allocator);
  uint64_string<rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
            ((Fossilize *)&local_108,hash,allocator);
  allocator_00 = allocator;
  rapidjson::
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
  AddMember(&serialized_shader_modules,
            (GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
             *)&local_108,&varint,allocator);
  local_158.s = "version";
  local_158.length = 7;
  rapidjson::
  GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>::
  AddMember<Fossilize::__2>
            ((GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
              *)&doc,&local_158,(anon_enum_32)allocator,allocator_00);
  local_168.s = "shaderModules";
  local_168.length = 0xd;
  rapidjson::
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
  AddMember(&doc.
             super_GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
            ,&local_168,&serialized_shader_modules,allocator);
  local_68.stack_ = (char *)0x0;
  local_68.stackTop_ = (char *)0x0;
  local_68.stackEnd_ = (char *)0x0;
  local_68.allocator_ = (CrtAllocator *)0x0;
  local_68.ownAllocator_ = (CrtAllocator *)0x0;
  local_68.initialCapacity_ = 0x100;
  local_108.level_stack_.allocator_ = (CrtAllocator *)0x0;
  local_108.level_stack_.ownAllocator_ = (CrtAllocator *)0x0;
  local_108.level_stack_.stackEnd_ = (char *)0x0;
  local_108.level_stack_.stack_ = (char *)0x0;
  local_108.level_stack_.stackTop_ = (char *)0x0;
  local_108.level_stack_.initialCapacity_ = 0x200;
  local_108.maxDecimalPlaces_ = 0x144;
  local_108.hasRoot_ = false;
  local_108.os_ = (GenericStringBuffer<rapidjson::UTF8<char>,_rapidjson::CrtAllocator> *)&local_68;
  rapidjson::
  GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>::
  Accept<rapidjson::Writer<rapidjson::GenericStringBuffer<rapidjson::UTF8<char>,rapidjson::CrtAllocator>,rapidjson::UTF8<char>,rapidjson::UTF8<char>,rapidjson::CrtAllocator,0u>>
            ((GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
              *)&doc,&local_108);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
            (blob,(size_type)(local_68.stackTop_ + (size - (long)local_68.stack_) + 1));
  __dest = (blob->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
           super__Vector_impl_data._M_start;
  __src = rapidjson::GenericStringBuffer<rapidjson::UTF8<char>,_rapidjson::CrtAllocator>::GetString
                    ((GenericStringBuffer<rapidjson::UTF8<char>,_rapidjson::CrtAllocator> *)
                     &local_68);
  memcpy(__dest,__src,(long)local_68.stackTop_ - (long)local_68.stack_);
  local_68.stackTop_
  [(long)(blob->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
         super__Vector_impl_data._M_start - (long)local_68.stack_] = '\0';
  memcpy(local_68.stackTop_ +
         (long)((blob->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
                super__Vector_impl_data._M_start + (1 - (long)local_68.stack_)),buffer,size);
  rapidjson::internal::Stack<rapidjson::CrtAllocator>::Destroy(&local_108.level_stack_);
  rapidjson::internal::Stack<rapidjson::CrtAllocator>::Destroy(&local_68);
  rapidjson::
  GenericDocument<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,_rapidjson::CrtAllocator>
  ::~GenericDocument(&doc);
  return true;
}

Assistant:

bool StateRecorder::Impl::serialize_shader_module(Hash hash, const VkShaderModuleCreateInfo &create_info,
                                                  vector<uint8_t> &blob, ScratchAllocator &blob_allocator) const
{
	Document doc;
	doc.SetObject();
	auto &alloc = doc.GetAllocator();

	Value serialized_shader_modules(kObjectType);

	size_t size = compute_size_varint(create_info.pCode, create_info.codeSize / 4);
	uint8_t *encoded = static_cast<uint8_t *>(blob_allocator.allocate_raw(size, 64));
	encode_varint(encoded, create_info.pCode, create_info.codeSize / 4);

	Value varint(kObjectType);
	varint.AddMember("varintOffset", 0, alloc);
	varint.AddMember("varintSize", uint64_t(size), alloc);
	varint.AddMember("codeSize", uint64_t(create_info.codeSize), alloc);
	varint.AddMember("flags", 0, alloc);

	// Varint binary form, starts at offset 0 after the delim '\0' character.
	serialized_shader_modules.AddMember(uint64_string(hash, alloc), varint, alloc);

	doc.AddMember("version", FOSSILIZE_FORMAT_VERSION, alloc);
	doc.AddMember("shaderModules", serialized_shader_modules, alloc);

	StringBuffer buffer;
	CustomWriter writer(buffer);
	doc.Accept(writer);

	blob.resize(buffer.GetSize() + 1 + size);
	memcpy(blob.data(), buffer.GetString(), buffer.GetSize());
	blob[buffer.GetSize()] = '\0';
	memcpy(blob.data() + buffer.GetSize() + 1, encoded, size);
	return true;
}